

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::assign_impl
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,size_type count,long *value)

{
  long lVar1;
  long *plVar2;
  size_t sVar3;
  long *plVar4;
  
  plVar2 = choose_data(this,count);
  this->m_end = plVar2;
  this->m_begin = plVar2;
  if (count != 0) {
    lVar1 = *value;
    plVar4 = plVar2;
    do {
      *plVar4 = lVar1;
      plVar4 = plVar4 + 1;
      count = count - 1;
    } while (count != 0);
    this->m_end = plVar4;
  }
  sVar3 = 4;
  if ((type *)plVar2 != this->m_static_data) {
    sVar3 = this->m_dynamic_capacity;
  }
  this->m_capacity = sVar3;
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }